

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_IsFormatSupported
                  (PaStreamParameters *inputParameters,PaStreamParameters *outputParameters,
                  double sampleRate)

{
  PaStreamParameters *local_90;
  PaStreamParameters *hostApiOutputParametersPtr;
  PaStreamParameters *hostApiInputParametersPtr;
  PaStreamParameters hostApiOutputParameters;
  PaStreamParameters hostApiInputParameters;
  PaDeviceIndex hostApiOutputDevice;
  PaDeviceIndex hostApiInputDevice;
  PaUtilHostApiRepresentation *hostApi;
  double dStack_28;
  PaError result;
  double sampleRate_local;
  PaStreamParameters *outputParameters_local;
  PaStreamParameters *inputParameters_local;
  
  _hostApiOutputDevice = (PaUtilHostApiRepresentation *)0x0;
  hostApiInputParameters.hostApiSpecificStreamInfo._4_4_ = 0xffffffff;
  hostApiInputParameters.hostApiSpecificStreamInfo._0_4_ = 0xffffffff;
  if (initializationCount_ == 0) {
    inputParameters_local._4_4_ = -10000;
  }
  else {
    dStack_28 = sampleRate;
    sampleRate_local = (double)outputParameters;
    outputParameters_local = inputParameters;
    hostApi._4_4_ =
         ValidateOpenStreamParameters
                   (inputParameters,outputParameters,sampleRate,0,0,(PaStreamCallback *)0x0,
                    (PaUtilHostApiRepresentation **)&hostApiOutputDevice,
                    (PaDeviceIndex *)((long)&hostApiInputParameters.hostApiSpecificStreamInfo + 4),
                    (PaDeviceIndex *)&hostApiInputParameters.hostApiSpecificStreamInfo);
    inputParameters_local._4_4_ = hostApi._4_4_;
    if (hostApi._4_4_ == 0) {
      if (outputParameters_local == (PaStreamParameters *)0x0) {
        hostApiOutputParametersPtr = (PaStreamParameters *)0x0;
      }
      else {
        hostApiOutputParameters.hostApiSpecificStreamInfo._0_4_ =
             hostApiInputParameters.hostApiSpecificStreamInfo._4_4_;
        hostApiOutputParameters.hostApiSpecificStreamInfo._4_4_ =
             outputParameters_local->channelCount;
        hostApiInputParameters._0_8_ = outputParameters_local->sampleFormat;
        hostApiInputParameters.sampleFormat =
             (PaSampleFormat)outputParameters_local->suggestedLatency;
        hostApiInputParameters.suggestedLatency =
             (PaTime)outputParameters_local->hostApiSpecificStreamInfo;
        hostApiOutputParametersPtr =
             (PaStreamParameters *)&hostApiOutputParameters.hostApiSpecificStreamInfo;
      }
      if (sampleRate_local == 0.0) {
        local_90 = (PaStreamParameters *)0x0;
      }
      else {
        hostApiInputParametersPtr._0_4_ = hostApiInputParameters.hostApiSpecificStreamInfo._0_4_;
        hostApiInputParametersPtr._4_4_ = *(undefined4 *)((long)sampleRate_local + 4);
        hostApiOutputParameters._0_8_ = *(undefined8 *)((long)sampleRate_local + 8);
        hostApiOutputParameters.sampleFormat = *(PaSampleFormat *)((long)sampleRate_local + 0x10);
        hostApiOutputParameters.suggestedLatency = *(PaTime *)((long)sampleRate_local + 0x18);
        local_90 = (PaStreamParameters *)&hostApiInputParametersPtr;
      }
      inputParameters_local._4_4_ =
           (*_hostApiOutputDevice->IsFormatSupported)
                     (_hostApiOutputDevice,hostApiOutputParametersPtr,local_90,dStack_28);
    }
  }
  return inputParameters_local._4_4_;
}

Assistant:

PaError Pa_IsFormatSupported( const PaStreamParameters *inputParameters,
                              const PaStreamParameters *outputParameters,
                              double sampleRate )
{
    PaError result;
    PaUtilHostApiRepresentation *hostApi = 0;
    PaDeviceIndex hostApiInputDevice = paNoDevice, hostApiOutputDevice = paNoDevice;
    PaStreamParameters hostApiInputParameters, hostApiOutputParameters;
    PaStreamParameters *hostApiInputParametersPtr, *hostApiOutputParametersPtr;


#ifdef PA_LOG_API_CALLS
    PA_LOGAPI_ENTER_PARAMS( "Pa_IsFormatSupported" );

    if( inputParameters == NULL ){
        PA_LOGAPI(("\tPaStreamParameters *inputParameters: NULL\n" ));
    }else{
        PA_LOGAPI(("\tPaStreamParameters *inputParameters: 0x%p\n", inputParameters ));
        PA_LOGAPI(("\tPaDeviceIndex inputParameters->device: %d\n", inputParameters->device ));
        PA_LOGAPI(("\tint inputParameters->channelCount: %d\n", inputParameters->channelCount ));
        PA_LOGAPI(("\tPaSampleFormat inputParameters->sampleFormat: %d\n", inputParameters->sampleFormat ));
        PA_LOGAPI(("\tPaTime inputParameters->suggestedLatency: %f\n", inputParameters->suggestedLatency ));
        PA_LOGAPI(("\tvoid *inputParameters->hostApiSpecificStreamInfo: 0x%p\n", inputParameters->hostApiSpecificStreamInfo ));
    }

    if( outputParameters == NULL ){
        PA_LOGAPI(("\tPaStreamParameters *outputParameters: NULL\n" ));
    }else{
        PA_LOGAPI(("\tPaStreamParameters *outputParameters: 0x%p\n", outputParameters ));
        PA_LOGAPI(("\tPaDeviceIndex outputParameters->device: %d\n", outputParameters->device ));
        PA_LOGAPI(("\tint outputParameters->channelCount: %d\n", outputParameters->channelCount ));
        PA_LOGAPI(("\tPaSampleFormat outputParameters->sampleFormat: %d\n", outputParameters->sampleFormat ));
        PA_LOGAPI(("\tPaTime outputParameters->suggestedLatency: %f\n", outputParameters->suggestedLatency ));
        PA_LOGAPI(("\tvoid *outputParameters->hostApiSpecificStreamInfo: 0x%p\n", outputParameters->hostApiSpecificStreamInfo ));
    }
    
    PA_LOGAPI(("\tdouble sampleRate: %g\n", sampleRate ));
#endif

    if( !PA_IS_INITIALISED_ )
    {
        result = paNotInitialized;

        PA_LOGAPI_EXIT_PAERROR( "Pa_IsFormatSupported", result );
        return result;
    }

    result = ValidateOpenStreamParameters( inputParameters,
                                           outputParameters,
                                           sampleRate, 0, paNoFlag, 0,
                                           &hostApi,
                                           &hostApiInputDevice,
                                           &hostApiOutputDevice );
    if( result != paNoError )
    {
        PA_LOGAPI_EXIT_PAERROR( "Pa_IsFormatSupported", result );
        return result;
    }
    

    if( inputParameters )
    {
        hostApiInputParameters.device = hostApiInputDevice;
        hostApiInputParameters.channelCount = inputParameters->channelCount;
        hostApiInputParameters.sampleFormat = inputParameters->sampleFormat;
        hostApiInputParameters.suggestedLatency = inputParameters->suggestedLatency;
        hostApiInputParameters.hostApiSpecificStreamInfo = inputParameters->hostApiSpecificStreamInfo;
        hostApiInputParametersPtr = &hostApiInputParameters;
    }
    else
    {
        hostApiInputParametersPtr = NULL;
    }

    if( outputParameters )
    {
        hostApiOutputParameters.device = hostApiOutputDevice;
        hostApiOutputParameters.channelCount = outputParameters->channelCount;
        hostApiOutputParameters.sampleFormat = outputParameters->sampleFormat;
        hostApiOutputParameters.suggestedLatency = outputParameters->suggestedLatency;
        hostApiOutputParameters.hostApiSpecificStreamInfo = outputParameters->hostApiSpecificStreamInfo;
        hostApiOutputParametersPtr = &hostApiOutputParameters;
    }
    else
    {
        hostApiOutputParametersPtr = NULL;
    }

    result = hostApi->IsFormatSupported( hostApi,
                                  hostApiInputParametersPtr, hostApiOutputParametersPtr,
                                  sampleRate );

#ifdef PA_LOG_API_CALLS
    PA_LOGAPI(("Pa_OpenStream returned:\n" ));
    if( result == paFormatIsSupported )
        PA_LOGAPI(("\tPaError: 0 [ paFormatIsSupported ]\n" ));
    else
        PA_LOGAPI(("\tPaError: %d ( %s )\n", result, Pa_GetErrorText( result ) ));
#endif

    return result;
}